

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<long_double>::default_cost_type
          (default_cost_type<long_double> *this,objective_function *obj_,int n)

{
  longdouble *plVar1;
  pointer poVar2;
  pointer poVar3;
  long lVar4;
  
  this->obj = obj_;
  std::make_unique<long_double[]>((size_t)&this->linear_elements);
  plVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
           super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  poVar3 = (this->obj->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = (this->obj->elements).
           super__Vector_base<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (poVar3 == poVar2) {
      return;
    }
    lVar4 = (long)poVar3->variable_index;
    if ((lVar4 < 0) || (n <= poVar3->variable_index)) break;
    plVar1[lVar4] = plVar1[lVar4] + (longdouble)poVar3->factor;
    poVar3 = poVar3 + 1;
  }
  details::fail_fast("Postcondition","0 <= elem.variable_index && elem.variable_index < n",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                     ,"1011");
}

Assistant:

default_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        for (const auto& elem : obj.elements) {
            bx_ensures(0 <= elem.variable_index && elem.variable_index < n);

            linear_elements[elem.variable_index] +=
              static_cast<Float>(elem.factor);
        }
    }